

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall FormatTest_ToString_Test::TestBody(FormatTest_ToString_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  char (*in_stack_ffffffffffffff38) [3];
  string *expected;
  char *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  int line;
  string *file;
  Type in_stack_ffffffffffffff5c;
  AssertHelper *in_stack_ffffffffffffff60;
  string local_90 [40];
  void **in_stack_ffffffffffffff98;
  Message *in_stack_ffffffffffffffa8;
  AssertHelper *in_stack_ffffffffffffffb0;
  string local_38 [32];
  AssertionResult local_18;
  
  file = local_38;
  fmt::v5::to_string<int>((int *)in_stack_ffffffffffffff98);
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
             in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
  std::__cxx11::string::~string(local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  line = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff4c);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff60);
    in_stack_ffffffffffffff40 =
         testing::AssertionResult::failure_message((AssertionResult *)0x181467);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,(char *)file,line,
               in_stack_ffffffffffffff40);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
    testing::Message::~Message((Message *)0x1814bb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x18150d);
  expected = local_90;
  fmt::v5::to_string<void*>(in_stack_ffffffffffffff98);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((char *)CONCAT44(line,in_stack_ffffffffffffff48),in_stack_ffffffffffffff40,
             (char (*) [7])expected,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
  std::__cxx11::string::~string(local_90);
  uVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_90 + 0x20));
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff60);
    testing::AssertionResult::failure_message((AssertionResult *)0x1815dd);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,(char *)file,line,
               in_stack_ffffffffffffff40);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar2,in_stack_ffffffffffffff30));
    testing::Message::~Message((Message *)0x181629);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x181675);
  return;
}

Assistant:

TEST(FormatTest, ToString) {
  EXPECT_EQ("42", fmt::to_string(42));
  EXPECT_EQ("0x1234", fmt::to_string(reinterpret_cast<void*>(0x1234)));
}